

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileByName
          (EncodedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  pair<const_void_*,_int> pVar2;
  pair<const_void_*,_int> encoded_file;
  FileDescriptorProto *output_local;
  string *filename_local;
  EncodedDescriptorDatabase *this_local;
  
  pVar2 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindFile
                    (&this->index_,filename);
  encoded_file._12_4_ = 0;
  encoded_file.first = (void *)SUB128(pVar2._0_12_,0);
  encoded_file.second = SUB124(pVar2._0_12_,8);
  bVar1 = MaybeParse(this,encoded_file,output);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileByName(
    const string& filename,
    FileDescriptorProto* output) {
  return MaybeParse(index_.FindFile(filename), output);
}